

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void __thiscall osThread::osThread(osThread *this)

{
  osEvent::osEvent(&this->ThreadStart,"ThreadStart");
  this->USleepTime = 0;
  this->Filename = "";
  this->Linenumber = 0;
  this->State = INIT;
  return;
}

Assistant:

osThread::osThread()
    : ThreadStart("ThreadStart")
{
    USleepTime = 0;
    State = INIT;
    Filename = "";
    Linenumber = 0;
#ifdef _WIN32
    Handle = 0;
    ThreadId = 0;
#elif __linux__
#endif
}